

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

bool isValidHttpHeaderValueField(QAnyStringView value)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar3 = value.m_size & 0xc000000000000000;
  if (uVar3 != 0x4000000000000000) {
    uVar3 = -uVar3;
  }
  bVar1 = std::all_of<char_const*,__9>
                    (value.field_0.m_data,
                     (value.m_size & 0x3fffffffffffffff) + (long)value.field_0.m_data,
                     0x4000000000000000,uVar3);
  bVar2 = true;
  if (!bVar1) {
    lcQHttpHeaders();
    if (((byte)lcQHttpHeaders::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
       ) {
      isValidHttpHeaderValueField();
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool isValidHttpHeaderValueField(QAnyStringView value) noexcept
{
    const bool valid = value.visit([](auto value){ return headerValueValidImpl(value); });
    if (!valid)
        qCWarning(lcQHttpHeaders, "HTTP header value contained illegal character(s)");
    return valid;
}